

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

ostream * lest::operator<<(ostream *os,comment *note)

{
  bool local_be;
  allocator local_a9;
  string local_a8 [32];
  string local_88 [39];
  byte local_61;
  string local_60 [32];
  string local_40 [32];
  comment *local_20;
  comment *note_local;
  ostream *os_local;
  
  local_20 = note;
  note_local = (comment *)os;
  local_be = comment::operator_cast_to_bool(note);
  local_61 = 0;
  if (local_be) {
    std::operator+((char *)local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1a7a44);
    local_61 = 1;
    std::__cxx11::string::string(local_40,local_60);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,"",&local_a9);
    std::__cxx11::string::string(local_88,local_a8);
    std::__cxx11::string::string(local_40,local_88);
  }
  local_be = !local_be;
  os_local = std::operator<<(os,local_40);
  std::__cxx11::string::~string(local_40);
  if (local_be) {
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  }
  if ((local_61 & 1) != 0) {
    std::__cxx11::string::~string(local_60);
  }
  return os_local;
}

Assistant:

inline std::ostream & operator<<( std::ostream & os, comment note )
{
    return os << (note ? " " + note.info : "" );
}